

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewtObj.c
# Opt level: O1

newtRef NewtMakeString2(char *s,uint32_t len,_Bool literal)

{
  newtRef nVar1;
  undefined8 *puVar2;
  ulong uVar3;
  
  nVar1 = NewtMakeBinary(newt_sym.string,(uint8_t *)s,len + 1,literal);
  if ((nVar1 != 2) && (nVar1 != 0xfff2)) {
    puVar2 = (undefined8 *)(nVar1 + 0x17);
    if ((*(byte *)(nVar1 + 3) & 0x40) == 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    uVar3 = (ulong)len;
    if (s == (char *)0x0) {
      uVar3 = 0;
    }
    *(undefined1 *)((long)puVar2 + uVar3) = 0;
  }
  return nVar1;
}

Assistant:

newtRef NewtMakeString2(const char *s, uint32_t len, bool literal)
{
    newtRefVar  r;
    
    r = NewtMakeBinary(NSSYM0(string), (uint8_t *)s, len + 1, literal); 
    
    if (NewtRefIsNotNIL(r))
    {
        char *	objData;
        
        objData = NewtRefToString(r);
        
        if (s != NULL && 0 < len)
        {
            //			strncpy(objData, s, len);
            objData[len] = '\0';
        }
        else
        {
            objData[0] = '\0';
        }
    }
    
    return r;
}